

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretEq
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  _List_node_base *p_Var1;
  int iVar2;
  Trace *this_00;
  _List_node_base *p_Var3;
  CharStringOperand newOperand;
  _List_node_base *local_28;
  value_type local_20;
  
  iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x23])
                    (this->mImplementationHelper,this);
  if (iVar2 == 0) {
    if ((this->mOperandStack).
        super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
        _M_size < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretEq, eq should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var1 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      local_28 = p_Var1[1]._M_prev;
      if (((ulong)p_Var1[1]._M_next & 1) != 0) {
        local_28 = (_List_node_base *)(double)(long)local_28;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      p_Var1 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var3 = p_Var1[1]._M_prev;
      if (((ulong)p_Var1[1]._M_next & 1) != 0) {
        p_Var3 = (_List_node_base *)(double)(long)p_Var3;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      local_20.IsInteger = true;
      local_20.field_1._0_4_ = -(uint)((double)local_28 == (double)p_Var3) & 1;
      local_20.field_1.IntegerValue._4_4_ = 0;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,&local_20);
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretEq(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Eq(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretEq, eq should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}

	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	newOperand.IsInteger = true;
	newOperand.IntegerValue = (
	(valueB.IsInteger ? valueB.IntegerValue : valueB.RealValue) ==
	(valueA.IsInteger ? valueA.IntegerValue : valueA.RealValue)
	) ? 1:0;	
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}